

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSVparser.cpp
# Opt level: O2

string * __thiscall
csv::Row::operator[][abi_cxx11_(string *__return_storage_ptr__,Row *this,uint valuePosition)

{
  pointer pbVar1;
  Error *this_00;
  allocator local_39;
  string local_38;
  
  pbVar1 = (this->_values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)valuePosition <
      (ulong)((long)(this->_values).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(pbVar1 + valuePosition));
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"can\'t return this value (doesn\'t exist)",&local_39);
  Error::Error(this_00,&local_38);
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::string Row::operator[](unsigned int valuePosition) const
  {
       if (valuePosition < _values.size())
           return _values[valuePosition];
       throw Error("can't return this value (doesn't exist)");
  }